

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O3

int SearchColorNoIdx(uint32_t *sorted,uint32_t color,int num_colors)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int hi;
  
  iVar2 = 0;
  if (*sorted != color) {
    iVar3 = 0;
    do {
      iVar2 = num_colors + iVar3 >> 1;
      iVar1 = iVar2;
      if (color <= sorted[iVar2]) {
        num_colors = iVar2;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
    } while (sorted[iVar2] != color);
  }
  return iVar2;
}

Assistant:

int SearchColorNoIdx(const uint32_t sorted[], uint32_t color, int num_colors) {
  int low = 0, hi = num_colors;
  if (sorted[low] == color) return low;  // loop invariant: sorted[low] != color
  while (1) {
    const int mid = (low + hi) >> 1;
    if (sorted[mid] == color) {
      return mid;
    } else if (sorted[mid] < color) {
      low = mid;
    } else {
      hi = mid;
    }
  }
  assert(0);
  return 0;
}